

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall minibag::View::iterator::increment(iterator *this)

{
  pointer ppBVar1;
  bool bVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  reference pvVar6;
  View *in_RDI;
  const_iterator unaff_retaddr;
  const_iterator last_iter;
  vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
  *in_stack_ffffffffffffff78;
  vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
  *in_stack_ffffffffffffff80;
  reference in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  _Self local_18;
  _Base_ptr local_10;
  View *this_00;
  
  this_00 = in_RDI;
  if ((in_RDI->queries_).
      super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    ppBVar1 = (in_RDI->queries_).
              super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (ppBVar1 != (pointer)0x0) {
      operator_delete(ppBVar1,0x28);
    }
    (in_RDI->queries_).super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  update(in_RDI);
  if (*(int *)&(in_RDI->queries_).
               super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>._M_impl
               .super__Vector_impl_data._M_finish !=
      *(int *)((in_RDI->ranges_).
               super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
               ._M_impl.super__Vector_impl_data._M_start + 6)) {
    pvVar3 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::back
                       (in_stack_ffffffffffffff80);
    local_10 = (pvVar3->iter)._M_node;
    populateSeek((iterator *)this_00,unaff_retaddr);
  }
  if ((*(byte *)((long)(in_RDI->ranges_).
                       super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x3c) & 1) == 0) {
    std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::back
              (in_stack_ffffffffffffff80);
    std::_Rb_tree_const_iterator<minibag::IndexEntry>::operator++
              (&in_stack_ffffffffffffff88->iter,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    pvVar3 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::back
                       (in_stack_ffffffffffffff80);
    pvVar6 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::back
                       ((vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_> *
                        )pvVar3);
    bVar2 = std::operator==(&pvVar3->iter,&pvVar6->range->end);
    if (bVar2) {
      std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::pop_back
                ((vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_> *)
                 0x17a89b);
    }
    iVar4 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::begin
                      (in_stack_ffffffffffffff78);
    iVar5 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::end
                      (in_stack_ffffffffffffff78);
    std::
    sort<__gnu_cxx::__normal_iterator<minibag::ViewIterHelper*,std::vector<minibag::ViewIterHelper,std::allocator<minibag::ViewIterHelper>>>,minibag::ViewIterHelperCompare>
              (iVar4._M_current,iVar5._M_current);
  }
  else {
    pvVar3 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::back
                       (in_stack_ffffffffffffff80);
    local_18._M_node = (pvVar3->iter)._M_node;
    while( true ) {
      bVar2 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::empty
                        ((vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
                          *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      in_stack_ffffffffffffff97 = false;
      if (!bVar2) {
        pvVar3 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::
                 back(in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff97 = std::operator==(&pvVar3->iter,&local_18);
      }
      if ((bool)in_stack_ffffffffffffff97 == false) break;
      std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::back
                (in_stack_ffffffffffffff80);
      std::_Rb_tree_const_iterator<minibag::IndexEntry>::operator++
                (&in_stack_ffffffffffffff88->iter,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      in_stack_ffffffffffffff88 =
           std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::back
                     (in_stack_ffffffffffffff80);
      pvVar3 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::back
                         (in_stack_ffffffffffffff80);
      bVar2 = std::operator==(&in_stack_ffffffffffffff88->iter,&pvVar3->range->end);
      if (bVar2) {
        std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::pop_back
                  ((vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_> *)
                   0x17a7f8);
      }
      iVar4 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::begin
                        (in_stack_ffffffffffffff78);
      iVar5 = std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::end
                        (in_stack_ffffffffffffff78);
      std::
      sort<__gnu_cxx::__normal_iterator<minibag::ViewIterHelper*,std::vector<minibag::ViewIterHelper,std::allocator<minibag::ViewIterHelper>>>,minibag::ViewIterHelperCompare>
                (iVar4._M_current,iVar5._M_current);
    }
  }
  return;
}

Assistant:

void View::iterator::increment() {
    assert(view_ != NULL);

    // Our message instance is no longer valid
    if (message_instance_ != NULL)
    {
      delete message_instance_;
      message_instance_ = NULL;
    }

    view_->update();

    // Note, updating may have blown away our message-ranges and
    // replaced them in general the ViewIterHelpers are no longer
    // valid, but the iterator it stores should still be good.
    if (view_revision_ != view_->view_revision_)
        populateSeek(iters_.back().iter);

    if (view_->reduce_overlap_)
    {
        std::multiset<IndexEntry>::const_iterator last_iter = iters_.back().iter;
    
        while (!iters_.empty() && iters_.back().iter == last_iter)
        {
            iters_.back().iter++;
            if (iters_.back().iter == iters_.back().range->end)
                iters_.pop_back();
      
            std::sort(iters_.begin(), iters_.end(), ViewIterHelperCompare());
        }

    } else {

        iters_.back().iter++;
        if (iters_.back().iter == iters_.back().range->end)
            iters_.pop_back();
      
        std::sort(iters_.begin(), iters_.end(), ViewIterHelperCompare());
    }
}